

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall
cmGeneratedFileStreamBase::cmGeneratedFileStreamBase(cmGeneratedFileStreamBase *this,string *name)

{
  string *name_local;
  cmGeneratedFileStreamBase *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->TempExt);
  std::__cxx11::string::string((string *)&this->TempName);
  this->CopyIfDifferent = false;
  this->Okay = false;
  this->Compress = false;
  this->CompressExtraExtension = true;
  Open(this,name);
  return;
}

Assistant:

cmGeneratedFileStreamBase::cmGeneratedFileStreamBase(std::string const& name)
{
  this->Open(name);
}